

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  uint64_t uVar1;
  TValue *pTVar2;
  char *__s;
  uint uVar3;
  size_t lenx;
  GCstr *pGVar4;
  GCtab *t;
  long lVar5;
  
  uVar3 = lj_lib_checkint(L,1);
  if ((uVar3 == 0) || (uVar1 = (L->glref).ptr64, *(uint *)(uVar1 + 0x46c) <= uVar3)) {
    lVar5 = 0;
  }
  else {
    lVar5 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar3 * 8);
  }
  if (lVar5 != 0) {
    lua_createtable(L,0,8);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    setintfield(L,t,"nins",*(int *)(lVar5 + 0xc) + -0x8001);
    setintfield(L,t,"nk",0x8000 - *(int *)(lVar5 + 0x28));
    setintfield(L,t,"link",(uint)*(ushort *)(lVar5 + 0x6a));
    setintfield(L,t,"nexit",(uint)*(ushort *)(lVar5 + 10));
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    __s = jit_trlinkname[*(byte *)(lVar5 + 0x74)];
    lenx = strlen(__s);
    pGVar4 = lj_str_new(L,__s,lenx);
    pTVar2->u64 = (ulong)pGVar4 | 0xfffd800000000000;
    lua_setfield(L,-2,"linktype");
  }
  return (uint)(lVar5 != 0);
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}